

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall ACSStringPool::MarkStringMap(ACSStringPool *this,FWorldGlobalArray *aray)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  PoolEntry *pPVar4;
  ConstPair *pCStack_30;
  int num;
  ConstPair *pair;
  ConstIterator it;
  FWorldGlobalArray *aray_local;
  ACSStringPool *this_local;
  
  it._8_8_ = aray;
  TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>::TMapConstIterator
            ((TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_> *)&pair,
             aray);
  while (bVar1 = TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>::
                 NextPair((TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>
                           *)&pair,&stack0xffffffffffffffd0), bVar1) {
    if ((pCStack_30->Value & 0xfff00000U) == 0x7ff00000) {
      uVar2 = pCStack_30->Value & 0xfffff;
      uVar3 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Size(&this->Pool);
      if (uVar2 < uVar3) {
        pPVar4 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                           (&this->Pool,(long)(int)uVar2);
        pPVar4->LockCount = pPVar4->LockCount | 0x80000000;
      }
    }
  }
  return;
}

Assistant:

void ACSStringPool::MarkStringMap(const FWorldGlobalArray &aray)
{
	FWorldGlobalArray::ConstIterator it(aray);
	FWorldGlobalArray::ConstPair *pair;

	while (it.NextPair(pair))
	{
		int num = pair->Value;
		if ((num & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR)
		{
			num &= ~LIBRARYID_MASK;
			if ((unsigned)num < Pool.Size())
			{
				Pool[num].LockCount |= 0x80000000;
			}
		}
	}
}